

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O2

LinkerScriptToken * nextToken(void)

{
  uint uVar1;
  char *pcVar2;
  char cVar3;
  uint __c;
  int iVar4;
  int iVar5;
  int iVar6;
  LinkerScriptTokenAttr LVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar8;
  LinkerScriptToken *extraout_RAX;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  char *pcVar13;
  int iVar14;
  char **ppcVar15;
  SectionTypeInfo *pSVar16;
  bool bVar17;
  undefined4 extraout_var;
  
  if (nextToken::token.type == TOKEN_STRING) {
    free(nextToken::token.attr.string);
  }
  do {
    do {
      LVar7._0_4_ = nextChar();
      LVar7._4_4_ = extraout_var;
    } while (LVar7._0_4_ == 9);
  } while (LVar7._0_4_ == 0x20);
  __c = LVar7._0_4_;
  if (LVar7._0_4_ == 0x3b) {
    do {
      do {
        __c = nextChar();
        uVar1 = __c + 1;
        LVar7._4_4_ = 0;
        LVar7.command = uVar1;
      } while (0xe < uVar1);
    } while ((0x4801U >> (uVar1 & 0x1f) & 1) == 0);
  }
  if (__c == 0xffffffff) {
    nextToken::token.type = TOKEN_EOF;
  }
  else if ((__c == 10) || (__c == 0xd)) {
    nextToken::token.type = TOKEN_NEWLINE;
    if (__c == 0xd) {
      LVar7._0_4_ = nextChar();
      LVar7._4_4_ = extraout_var_00;
      if (LVar7._0_4_ != 10) {
        iVar5 = ungetc(LVar7._0_4_,(FILE *)linkerScript);
        return (LinkerScriptToken *)CONCAT44(extraout_var_01,iVar5);
      }
    }
  }
  else {
    if (__c != 0x22) {
      uVar9 = 8;
      uVar11 = 0;
      pcVar10 = (char *)0x0;
      while( true ) {
        if (uVar9 <= uVar11 || pcVar10 == (char *)0x0) {
          uVar9 = uVar9 * 2;
          pcVar10 = (char *)realloc(pcVar10,uVar9);
          if (pcVar10 == (char *)0x0) {
            pcVar10 = "%s: Failed to allocate memory for token";
            goto LAB_00107654;
          }
        }
        iVar5 = toupper(__c);
        pcVar10[uVar11] = (char)iVar5;
        if (__c == 0) break;
        __c = nextChar();
        if ((__c < 0x3c) && ((0x800000100002600U >> ((ulong)__c & 0x3f) & 1) != 0)) {
          ungetc(__c,(FILE *)linkerScript);
          __c = 0;
        }
        uVar11 = uVar11 + 1;
      }
      nextToken::token.type = TOKEN_INVALID;
      ppcVar15 = commands;
      for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
        iVar5 = strcmp(*ppcVar15,pcVar10);
        if (iVar5 == 0) {
          nextToken::token.type = TOKEN_COMMAND;
          goto LAB_0010761b;
        }
        ppcVar15 = ppcVar15 + 1;
      }
      pSVar16 = sectionTypeInfo;
      for (lVar12 = 0; lVar12 != 8; lVar12 = lVar12 + 1) {
        iVar5 = strcmp(pSVar16->name,pcVar10);
        if (iVar5 == 0) {
          nextToken::token.type = TOKEN_BANK;
LAB_0010761b:
          nextToken::token.attr.command = (int)lVar12;
          goto LAB_00107622;
        }
        pSVar16 = pSVar16 + 1;
      }
      iVar5 = strcmp("INCLUDE",pcVar10);
      if (iVar5 == 0) {
        nextToken::token.type = TOKEN_INCLUDE;
      }
      else {
        bVar17 = *pcVar10 == '$';
        lVar12 = 10;
        if (bVar17) {
          lVar12 = 0x10;
        }
        if (pcVar10[bVar17] == '\0') {
LAB_00107662:
          errx("%s(%u): Unknown token \"%s\"",linkerScriptName,(ulong)lineNo,pcVar10);
        }
        nextToken::token.attr.string = nextToken::token.attr.string & 0xffffffff00000000;
        pcVar13 = pcVar10 + bVar17;
        cVar3 = *pcVar13;
        iVar5 = 0;
        do {
          pcVar13 = pcVar13 + 1;
          iVar4 = toupper((int)cVar3);
          lVar8 = 0;
          do {
            iVar14 = (int)lVar12;
            iVar6 = iVar14;
            if (lVar12 == lVar8) goto LAB_001075eb;
            pcVar2 = "0123456789ABCDEF" + lVar8;
            lVar8 = lVar8 + 1;
          } while ((char)iVar4 != *pcVar2);
          iVar6 = (int)lVar8 + -1;
LAB_001075eb:
          if (iVar14 == iVar6) goto LAB_00107662;
          iVar5 = iVar5 * iVar14 + iVar6;
          nextToken::token.attr.command = iVar5;
          cVar3 = *pcVar13;
        } while (cVar3 != '\0');
        nextToken::token.type = TOKEN_NUMBER;
      }
LAB_00107622:
      free(pcVar10);
      return extraout_RAX;
    }
    nextToken::token.type = TOKEN_STRING;
    nextToken::token.attr.string = (char *)0x0;
    uVar9 = 0x10;
    uVar11 = 0;
    do {
      iVar4 = nextChar();
      iVar5 = 0;
      if (iVar4 != 0x22) {
        if (iVar4 == 0x5c) {
          iVar4 = nextChar();
          iVar5 = iVar4;
          if (((iVar4 != 0x22) && (iVar4 != 0x5c)) && (iVar5 = 10, iVar4 != 0x6e)) {
            if (iVar4 == 0x72) {
              iVar5 = 0xd;
            }
            else {
              if (iVar4 != 0x74) {
                if (((iVar4 != -1) && (iVar4 != 0xd)) && (iVar4 != 10)) {
                  pcVar10 = "%s(%u): Illegal character escape";
                  goto LAB_001076a9;
                }
                goto LAB_00107692;
              }
              iVar5 = 9;
            }
          }
        }
        else if (((iVar4 == -1) || (iVar4 == 0xd)) || (iVar5 = iVar4, iVar4 == 10)) {
LAB_00107692:
          pcVar10 = "%s(%u): Unterminated string";
LAB_001076a9:
          errx(pcVar10,linkerScriptName,(ulong)lineNo);
        }
      }
      if (nextToken::token.attr.string == (char *)0x0 || uVar9 <= uVar11) {
        uVar9 = uVar9 * 2;
        nextToken::token.attr.string = (char *)realloc(nextToken::token.attr.string,uVar9);
        if (nextToken::token.attr.string == (char *)0x0) {
          pcVar10 = "%s: Failed to allocate memory for string";
          nextToken::token.attr.string = (char *)0x0;
LAB_00107654:
          err(pcVar10,"nextToken");
        }
      }
      LVar7 = nextToken::token.attr;
      nextToken::token.attr.string[uVar11] = (char)iVar5;
      uVar11 = uVar11 + 1;
    } while (iVar5 != 0);
  }
  return (LinkerScriptToken *)LVar7.string;
}

Assistant:

static struct LinkerScriptToken *nextToken(void)
{
	static struct LinkerScriptToken token;
	int curchar;

	// If the token has a string, make sure to avoid leaking it
	if (token.type == TOKEN_STRING)
		free(token.attr.string);

	// Skip initial whitespace...
	do
		curchar = nextChar();
	while (isWhiteSpace(curchar));

	// If this is a comment, skip to the end of the line
	if (curchar == ';') {
		do {
			curchar = nextChar();
		} while (!isNewline(curchar) && curchar != EOF);
	}

	if (curchar == EOF) {
		token.type = TOKEN_EOF;
	} else if (isNewline(curchar)) {
		// If we have a newline char, this is a newline token
		token.type = TOKEN_NEWLINE;

		if (curchar == '\r') {
			// Handle CRLF
			curchar = nextChar();
			if (curchar != '\n')
				ungetc(curchar, linkerScript);
		}
	} else if (curchar == '"') {
		// If we have a string start, this is a string
		token.type = TOKEN_STRING;
		token.attr.string = NULL; // Force initial alloc

		size_t size = 0;
		size_t capacity = 16; // Half of the default capacity

		do {
			curchar = nextChar();
			if (curchar == EOF || isNewline(curchar)) {
				errx("%s(%" PRIu32 "): Unterminated string",
				     linkerScriptName, lineNo);
			} else if (curchar == '"') {
				// Quotes force a string termination
				curchar = '\0';
			} else if (curchar == '\\') {
				// Backslashes are escape sequences
				curchar = nextChar();
				if (curchar == EOF || isNewline(curchar))
					errx("%s(%" PRIu32 "): Unterminated string",
					     linkerScriptName, lineNo);
				else if (curchar == 'n')
					curchar = '\n';
				else if (curchar == 'r')
					curchar = '\r';
				else if (curchar == 't')
					curchar = '\t';
				else if (curchar != '\\' && curchar != '"')
					errx("%s(%" PRIu32 "): Illegal character escape",
					     linkerScriptName, lineNo);
			}

			if (size >= capacity || token.attr.string == NULL) {
				capacity *= 2;
				token.attr.string = (char *)realloc(token.attr.string, capacity);
				if (!token.attr.string)
					err("%s: Failed to allocate memory for string",
					    __func__);
			}
			token.attr.string[size++] = curchar;
		} while (curchar);
	} else {
		// This is either a number, command or bank, that is: a word
		char *str = NULL;
		size_t size = 0;
		size_t capacity = 8; // Half of the default capacity

		for (;;) {
			if (size >= capacity || str == NULL) {
				capacity *= 2;
				str = (char *)realloc(str, capacity);
				if (!str)
					err("%s: Failed to allocate memory for token",
					    __func__);
			}
			str[size] = toupper(curchar);
			size++;

			if (!curchar)
				break;

			curchar = nextChar();
			// Whitespace, a newline or a comment end the token
			if (isWhiteSpace(curchar) || isNewline(curchar) || curchar == ';') {
				ungetc(curchar, linkerScript);
				curchar = '\0';
			}
		}

		token.type = TOKEN_INVALID;

		// Try to match a command
		for (enum LinkerScriptCommand i : EnumSeq(COMMAND_INVALID)) {
			if (!strcmp(commands[i], str)) {
				token.type = TOKEN_COMMAND;
				token.attr.command = i;
				break;
			}
		}

		if (token.type == TOKEN_INVALID) {
			// Try to match a bank specifier
			for (enum SectionType type : EnumSeq(SECTTYPE_INVALID)) {
				if (!strcmp(sectionTypeInfo[type].name, str)) {
					token.type = TOKEN_BANK;
					token.attr.secttype = type;
					break;
				}
			}
		}

		if (token.type == TOKEN_INVALID) {
			// Try to match an include token
			if (!strcmp("INCLUDE", str))
				token.type = TOKEN_INCLUDE;
		}

		if (token.type == TOKEN_INVALID) {
			// None of the strings matched, do we have a number?
			if (tryParseNumber(str, &token.attr.number))
				token.type = TOKEN_NUMBER;
			else
				errx("%s(%" PRIu32 "): Unknown token \"%s\"",
				     linkerScriptName, lineNo, str);
		}

		free(str);
	}

	return &token;
}